

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

CURLcode Curl_urldecode(char *string,size_t length,char **ostring,size_t *olen,urlreject ctrl)

{
  char *pcVar1;
  char *pcVar2;
  size_t local_70;
  char *local_68;
  char *ptr;
  char hexstr [3];
  ulong uStack_58;
  uchar in;
  unsigned_long hex;
  size_t strindex;
  char *ns;
  size_t alloc;
  urlreject ctrl_local;
  size_t *olen_local;
  char **ostring_local;
  size_t length_local;
  char *string_local;
  
  hex = 0;
  local_70 = length;
  if (length == 0) {
    local_70 = strlen(string);
  }
  ns = (char *)(local_70 + 1);
  pcVar1 = (char *)(*Curl_cmalloc)((size_t)ns);
  length_local = (size_t)string;
  if (pcVar1 == (char *)0x0) {
    string_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    while (pcVar2 = ns + -1, pcVar2 != (char *)0x0) {
      ptr._7_1_ = *(byte *)length_local;
      if (((ptr._7_1_ == 0x25) && ((char *)0x2 < pcVar2)) &&
         (((('/' < *(char *)(length_local + 1) && (*(char *)(length_local + 1) < ':')) ||
           ((('`' < *(char *)(length_local + 1) && (*(char *)(length_local + 1) < 'g')) ||
            (('@' < *(char *)(length_local + 1) && (*(char *)(length_local + 1) < 'G')))))) &&
          (((('/' < *(char *)(length_local + 2) && (*(char *)(length_local + 2) < ':')) ||
            (('`' < *(char *)(length_local + 2) && (*(char *)(length_local + 2) < 'g')))) ||
           (('@' < *(char *)(length_local + 2) && (*(char *)(length_local + 2) < 'G')))))))) {
        ptr._4_1_ = *(undefined1 *)(length_local + 1);
        ptr._5_1_ = *(undefined1 *)(length_local + 2);
        ptr._6_1_ = 0;
        uStack_58 = strtoul((char *)((long)&ptr + 4),&local_68,0x10);
        ptr._7_1_ = curlx_ultouc(uStack_58);
        length_local = length_local + 2;
        pcVar2 = ns + -3;
      }
      ns = pcVar2;
      if (((ctrl == REJECT_CTRL) && (ptr._7_1_ < 0x20)) ||
         ((ctrl == REJECT_ZERO && (ptr._7_1_ == 0)))) {
        (*Curl_cfree)(pcVar1);
        return CURLE_URL_MALFORMAT;
      }
      pcVar1[hex] = ptr._7_1_;
      length_local = length_local + 1;
      hex = hex + 1;
    }
    pcVar1[hex] = '\0';
    if (olen != (size_t *)0x0) {
      *olen = hex;
    }
    *ostring = pcVar1;
    string_local._4_4_ = CURLE_OK;
  }
  return string_local._4_4_;
}

Assistant:

CURLcode Curl_urldecode(const char *string, size_t length,
                        char **ostring, size_t *olen,
                        enum urlreject ctrl)
{
  size_t alloc;
  char *ns;
  size_t strindex = 0;
  unsigned long hex;

  DEBUGASSERT(string);
  DEBUGASSERT(ctrl >= REJECT_NADA); /* crash on TRUE/FALSE */

  alloc = (length?length:strlen(string)) + 1;
  ns = malloc(alloc);

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  while(--alloc > 0) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      char hexstr[3];
      char *ptr;
      hexstr[0] = string[1];
      hexstr[1] = string[2];
      hexstr[2] = 0;

      hex = strtoul(hexstr, &ptr, 16);

      in = curlx_ultouc(hex); /* this long is never bigger than 255 anyway */

      string += 2;
      alloc -= 2;
    }

    if(((ctrl == REJECT_CTRL) && (in < 0x20)) ||
       ((ctrl == REJECT_ZERO) && (in == 0))) {
      free(ns);
      return CURLE_URL_MALFORMAT;
    }

    ns[strindex++] = in;
    string++;
  }
  ns[strindex] = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = strindex;

  /* store output string */
  *ostring = ns;

  return CURLE_OK;
}